

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

void ixxx::posix::spawn_file_actions_addclose(posix_spawn_file_actions_t *as,int fd)

{
  int iVar1;
  spawn_file_actions_addclose_error *this;
  int r;
  int fd_local;
  posix_spawn_file_actions_t *as_local;
  
  iVar1 = posix_spawn_file_actions_addclose((posix_spawn_file_actions_t *)as,fd);
  if (iVar1 != 0) {
    this = (spawn_file_actions_addclose_error *)__cxa_allocate_exception(0x20);
    spawn_file_actions_addclose_error::sys_error(this,iVar1,(char *)0x0,ERRNO);
    __cxa_throw(this,&spawn_file_actions_addclose_error::typeinfo,
                spawn_file_actions_addclose_error::~spawn_file_actions_addclose_error);
  }
  return;
}

Assistant:

void spawn_file_actions_addclose(posix_spawn_file_actions_t *as, int fd)
    {
        int r = ::posix_spawn_file_actions_addclose(as, fd);
        if (r)
            throw spawn_file_actions_addclose_error(r);
    }